

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::print(ANN *this,uint index)

{
  uint uVar1;
  Perceptron *pPVar2;
  string *psVar3;
  ostream *poVar4;
  uint index_00;
  double dVar5;
  Perceptron perceptron;
  Perceptron perceptron_1;
  
  Perceptron::Perceptron(&perceptron);
  index_00 = 0;
  while( true ) {
    uVar1 = Layer::get_nb_perceptrons
                      ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_start + index);
    if (uVar1 <= index_00) break;
    pPVar2 = Layer::get_perceptron
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start + index,index_00);
    Perceptron::Perceptron(&perceptron_1,pPVar2);
    psVar3 = Layer::label_abi_cxx11_
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start + index,index_00);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)psVar3);
    std::operator<<(poVar4,": ");
    dVar5 = Perceptron::get_output(&perceptron_1);
    poVar4 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar4,'\n');
    Perceptron::~Perceptron(&perceptron_1);
    index_00 = index_00 + 1;
  }
  Perceptron::~Perceptron(&perceptron);
  return;
}

Assistant:

void ANN::print(uint index) const{
    Perceptron perceptron;
    for(uint i=0;i<m_layers[index].get_nb_perceptrons();++i){
        const Perceptron perceptron=m_layers[index].get_perceptron(i);
        std::cout<<m_layers[index].label(i)<<": "<<perceptron.get_output()<<'\n';
    }
}